

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppUTestNamerTests.cpp
# Opt level: O0

void __thiscall
TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test::testBody
          (TEST_NamerTestGroup_TestProperNameCaseOnWindows_Test *this)

{
  bool bVar1;
  TestName *this_00;
  UtestShell *pUVar2;
  undefined8 uVar3;
  TestName test;
  ApprovalTestNamer namer;
  ApprovalTestNamer *in_stack_fffffffffffffee8;
  TestName *in_stack_fffffffffffffef0;
  TestName *in_stack_ffffffffffffff00;
  TestName *in_stack_ffffffffffffff08;
  TestName *in_stack_ffffffffffffff10;
  undefined8 local_e0;
  string local_d8 [32];
  string *in_stack_ffffffffffffff48;
  string local_98 [152];
  
  bVar1 = ApprovalTests::SystemUtils::isWindowsOs();
  if (bVar1) {
    ApprovalTests::ApprovalTestNamer::ApprovalTestNamer
              ((ApprovalTestNamer *)in_stack_fffffffffffffef0);
    ApprovalTests::ApprovalTestNamer::currentTest(in_stack_ffffffffffffff00);
    ApprovalTests::TestName::TestName(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    this_00 = (TestName *)ApprovalTests::TestName::getFileName_abi_cxx11_(in_stack_fffffffffffffef0)
    ;
    std::__cxx11::string::string((string *)&stack0xffffffffffffff48,(string *)this_00);
    ApprovalTests::StringUtils::toLower(in_stack_ffffffffffffff48);
    ApprovalTests::TestName::setFileName(this_00,(string *)in_stack_ffffffffffffff08);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    ApprovalTests::ApprovalTestNamer::currentTest(in_stack_ffffffffffffff00);
    pUVar2 = UtestShell::getCurrent();
    ApprovalTests::ApprovalTestNamer::getFileName_abi_cxx11_(in_stack_fffffffffffffee8);
    uVar3 = std::__cxx11::string::c_str();
    local_e0 = 0;
    NormalTestTerminator::NormalTestTerminator((NormalTestTerminator *)in_stack_fffffffffffffef0);
    (*pUVar2->_vptr_UtestShell[9])
              (pUVar2,uVar3,"CppUTestNamerTests",0,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/CppUTest_Tests/namers/CppUTestNamerTests.cpp"
               ,0x35,&local_e0);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1175bd);
    std::__cxx11::string::~string(local_d8);
    ApprovalTests::TestName::~TestName(in_stack_fffffffffffffef0);
    ApprovalTests::ApprovalTestNamer::~ApprovalTestNamer((ApprovalTestNamer *)0x1175e3);
  }
  return;
}

Assistant:

TEST(NamerTestGroup, TestProperNameCaseOnWindows)
{
    if (SystemUtils::isWindowsOs())
    {
        ApprovalTestNamer namer;
        auto test = ApprovalTestNamer::currentTest();
        test.setFileName(StringUtils::toLower(test.getFileName()));
        ApprovalTestNamer::currentTest(&test);
        STRCMP_EQUAL(namer.getFileName().c_str(), "CppUTestNamerTests");
    }
}